

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

Block * __thiscall
google::protobuf::internal::ArenaImpl::NewBlock(ArenaImpl *this,Block *last_block,size_t min_bytes)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  Block *this_00;
  ulong in_RDX;
  Block *in_RSI;
  long in_RDI;
  Block *b;
  void *mem;
  size_t size;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  LogMessage *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff20;
  unsigned_long local_a8 [3];
  byte local_89;
  unsigned_long local_50;
  unsigned_long local_48;
  ulong local_40;
  Block *local_38;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_40 = in_RDX;
  local_38 = in_RSI;
  if (in_RSI == (Block *)0x0) {
    local_48 = *(unsigned_long *)(in_RDI + 0x28);
  }
  else {
    sVar2 = Block::size(in_RSI);
    local_50 = sVar2 << 1;
    puVar3 = std::min<unsigned_long>(&local_50,(unsigned_long *)(in_RDI + 0x30));
    local_48 = *puVar3;
  }
  uVar1 = local_40;
  uVar4 = std::numeric_limits<unsigned_long>::max();
  local_89 = 0;
  if (uVar4 - 0x18 < uVar1) {
    LogMessage::LogMessage
              (in_stack_ffffffffffffff20,level,(char *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0c);
    local_89 = 1;
    LogMessage::operator<<
              (in_stack_ffffffffffffff10,
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff10,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  if ((local_89 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x3dc494);
  }
  local_a8[0] = local_40 + 0x18;
  puVar3 = std::max<unsigned_long>(&local_48,local_a8);
  local_48 = *puVar3;
  this_00 = (Block *)(**(code **)(in_RDI + 0x48))(local_48);
  Block::Block(this_00,local_48,local_38);
  LOCK();
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + local_48;
  UNLOCK();
  return this_00;
}

Assistant:

ArenaImpl::Block* ArenaImpl::NewBlock(Block* last_block, size_t min_bytes) {
  size_t size;
  if (last_block) {
    // Double the current block size, up to a limit.
    size = std::min(2 * last_block->size(), options_.max_block_size);
  } else {
    size = options_.start_block_size;
  }
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  GOOGLE_CHECK_LE(min_bytes, std::numeric_limits<size_t>::max() - kBlockHeaderSize);
  size = std::max(size, kBlockHeaderSize + min_bytes);

  void* mem = options_.block_alloc(size);
  Block* b = new (mem) Block(size, last_block);
  space_allocated_.fetch_add(size, std::memory_order_relaxed);
  return b;
}